

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void TorControlConnection::eventcb(bufferevent *bev,short what,void *ctx)

{
  long lVar1;
  bool bVar2;
  char *fmt;
  Level level;
  undefined6 in_register_00000032;
  function<void_(TorControlConnection_&)> *this;
  int source_line;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  level = (Level)CONCAT62(in_register_00000032,what);
  if ((char)what < '\0') {
    bVar2 = ::LogAcceptCategory((LogFlags)bev,level);
    this = (function<void_(TorControlConnection_&)> *)ctx;
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "eventcb";
      logging_function._M_len = 7;
      ::LogPrintf_<>(logging_function,source_file,0x84,TOR,Debug,"Successfully connected!\n");
    }
  }
  else {
    if ((what & 0x30U) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_0088fa7c;
    }
    bVar2 = ::LogAcceptCategory((LogFlags)bev,level);
    if ((what & 0x20U) == 0) {
      if (bVar2) {
        fmt = "End of stream\n";
        source_line = 0x8a;
LAB_0088fa49:
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_00._M_len = 0x57;
        logging_function_00._M_str = "eventcb";
        logging_function_00._M_len = 7;
        ::LogPrintf_<>(logging_function_00,source_file_00,source_line,TOR,Debug,fmt);
      }
    }
    else if (bVar2) {
      fmt = "Error connecting to Tor control socket\n";
      source_line = 0x88;
      goto LAB_0088fa49;
    }
    Disconnect((TorControlConnection *)ctx);
    this = (function<void_(TorControlConnection_&)> *)((long)ctx + 0x20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::function<void_(TorControlConnection_&)>::operator()(this,(TorControlConnection *)ctx);
    return;
  }
LAB_0088fa7c:
  __stack_chk_fail();
}

Assistant:

void TorControlConnection::eventcb(struct bufferevent *bev, short what, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    if (what & BEV_EVENT_CONNECTED) {
        LogDebug(BCLog::TOR, "Successfully connected!\n");
        self->connected(*self);
    } else if (what & (BEV_EVENT_EOF|BEV_EVENT_ERROR)) {
        if (what & BEV_EVENT_ERROR) {
            LogDebug(BCLog::TOR, "Error connecting to Tor control socket\n");
        } else {
            LogDebug(BCLog::TOR, "End of stream\n");
        }
        self->Disconnect();
        self->disconnected(*self);
    }
}